

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb_strip_final_slash_regardless(char *t)

{
  size_t sVar1;
  
  if (*t != '\0') {
    sVar1 = strlen(t);
    if ((t[sVar1 - 1] == '\\') || (t[sVar1 - 1] == '/')) {
      t[sVar1 - 1] = '\0';
    }
  }
  return t;
}

Assistant:

char *stb_strip_final_slash_regardless(char *t)
{
   if (t[0]) {
      char *z = t + strlen(t) - 1;
      // *z is the last character
      if (*z == '\\' || *z == '/')
         *z = 0;
      if (*z == '\\')
         *z = '/'; // canonicalize to make sure it matches db
   }
   return t;
}